

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valcvt.h
# Opt level: O2

void __thiscall
mp::pre::ValuePresolverImpl::ValuePresolverImpl(ValuePresolverImpl *this,Env *env,BasicLogger *bts)

{
  allocator<char> local_41;
  string local_40;
  
  (this->super_BasicValuePresolver).super_EnvKeeper.env_ = env;
  (this->super_BasicValuePresolver)._vptr_BasicValuePresolver =
       (_func_int **)&PTR__ValuePresolverImpl_004bb7f0;
  (this->val_nodes_)._M_h._M_buckets = &(this->val_nodes_)._M_h._M_single_bucket;
  (this->val_nodes_)._M_h._M_bucket_count = 1;
  (this->val_nodes_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->val_nodes_)._M_h._M_element_count = 0;
  (this->val_nodes_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->val_nodes_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->val_nodes_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"src",&local_41);
  ModelValues<mp::pre::ValueMap<mp::pre::ValueNode,_mp::pre::BasicValuePresolver_&>_>::ModelValues
            (&this->src_,&this->super_BasicValuePresolver,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"dest",&local_41);
  ModelValues<mp::pre::ValueMap<mp::pre::ValueNode,_mp::pre::BasicValuePresolver_&>_>::ModelValues
            (&this->dest_,&this->super_BasicValuePresolver,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::_Deque_base<mp::pre::LinkRange,_std::allocator<mp::pre::LinkRange>_>::_Deque_base
            ((_Deque_base<mp::pre::LinkRange,_std::allocator<mp::pre::LinkRange>_> *)&this->brl_);
  this->bts_ = bts;
  this->i_exported_ = 0;
  (this->entry_items_).src_items_.
  super__Vector_base<mp::pre::NodeRange,_std::allocator<mp::pre::NodeRange>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->entry_items_).src_items_.
  super__Vector_base<mp::pre::NodeRange,_std::allocator<mp::pre::NodeRange>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->entry_items_).src_items_.
  super__Vector_base<mp::pre::NodeRange,_std::allocator<mp::pre::NodeRange>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->entry_items_).dest_items_.
  super__Vector_base<mp::pre::NodeRange,_std::allocator<mp::pre::NodeRange>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->entry_items_).dest_items_.
  super__Vector_base<mp::pre::NodeRange,_std::allocator<mp::pre::NodeRange>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->entry_items_).dest_items_.
  super__Vector_base<mp::pre::NodeRange,_std::allocator<mp::pre::NodeRange>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

ValuePresolverImpl(Env& env, BasicLogger& bts) :
    BasicValuePresolver(env), bts_(bts) { }